

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.cc
# Opt level: O0

string * leveldb::test::TmpDir_abi_cxx11_(void)

{
  bool b;
  Env *pEVar1;
  Tester *this;
  string *in_RDI;
  Status local_1f0 [4];
  Tester local_1d0;
  Status local_20;
  Status s;
  string *dir;
  
  s.state_._7_1_ = 0;
  std::__cxx11::string::string(in_RDI);
  pEVar1 = Env::Default();
  (*pEVar1->_vptr_Env[0x11])(&local_20,pEVar1,in_RDI);
  Tester::Tester(&local_1d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/testharness.cc"
                 ,0x43);
  b = Status::ok(&local_20);
  this = Tester::Is(&local_1d0,b,"s.ok()");
  Status::ToString_abi_cxx11_(local_1f0);
  Tester::operator<<(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1f0);
  std::__cxx11::string::~string((string *)local_1f0);
  Tester::~Tester(&local_1d0);
  s.state_._7_1_ = 1;
  Status::~Status(&local_20);
  if ((s.state_._7_1_ & 1) == 0) {
    std::__cxx11::string::~string(in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string TmpDir() {
  std::string dir;
  Status s = Env::Default()->GetTestDirectory(&dir);
  ASSERT_TRUE(s.ok()) << s.ToString();
  return dir;
}